

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query_result.cpp
# Opt level: O1

bool __thiscall
duckdb::QueryResultChunkScanState::LoadNextChunk(QueryResultChunkScanState *this,ErrorData *error)

{
  bool bVar1;
  
  if ((this->super_ChunkScanState).finished != false) {
    return false;
  }
  bVar1 = InternalLoad(this,error);
  if (!bVar1) {
    (this->super_ChunkScanState).finished = true;
  }
  (this->super_ChunkScanState).offset = 0;
  return (bool)((this->super_ChunkScanState).finished ^ 1);
}

Assistant:

bool QueryResultChunkScanState::LoadNextChunk(ErrorData &error) {
	if (finished) {
		return !finished;
	}
	auto load_result = InternalLoad(error);
	if (!load_result) {
		finished = true;
	}
	offset = 0;
	return !finished;
}